

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFerTron_dns.c
# Opt level: O2

void PrintOutput(N_Vector u)

{
  undefined8 *puVar1;
  
  puVar1 = *(undefined8 **)((long)u->content + 0x10);
  printf(" %8.6g  %8.6g\n",*puVar1,puVar1[1]);
  return;
}

Assistant:

static void PrintOutput(N_Vector u)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" %8.6Lg  %8.6Lg\n", Ith(u, 1), Ith(u, 2));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf(" %8.6g  %8.6g\n", Ith(u, 1), Ith(u, 2));
#else
  printf(" %8.6g  %8.6g\n", Ith(u, 1), Ith(u, 2));
#endif
}